

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::FunctionDeclarationSyntax::isKind(SyntaxKind kind)

{
  return kind == TaskDeclaration || kind == FunctionDeclaration;
}

Assistant:

bool FunctionDeclarationSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::TaskDeclaration:
            return true;
        default:
            return false;
    }
}